

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::DirectStateAccess::Buffers::DataTest::iterate(DataTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  undefined4 *puVar7;
  uint local_74;
  GLuint i_1;
  uint local_40;
  GLuint i;
  bool local_2e;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  DataTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    local_2e = true;
    this->m_pNamedBufferData = *(PFNGLNAMEDBUFFERDATA *)(lVar6 + 0xec0);
    this->m_pNamedBufferSubData = *(PFNGLNAMEDBUFFERSUBDATA *)(lVar6 + 0xee0);
    this->m_pNamedBufferStorage = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar6 + 0xed8);
    this->m_pCopyNamedBufferSubData = *(PFNGLCOPYNAMEDBUFFERSUBDATA *)(lVar6 + 0x340);
    if ((this->m_pNamedBufferData == (PFNGLNAMEDBUFFERDATA)0x0) ||
       (((this->m_pNamedBufferSubData == (PFNGLNAMEDBUFFERSUBDATA)0x0 ||
         (this->m_pNamedBufferStorage == (PFNGLNAMEDBUFFERSTORAGE)0x0)) ||
        (this->m_pCopyNamedBufferSubData == (PFNGLCOPYNAMEDBUFFERSUBDATA)0x0)))) {
      puVar7 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar7 = 0;
      __cxa_throw(puVar7,&int::typeinfo,0);
    }
    for (local_40 = 0; local_40 < 9; local_40 = local_40 + 1) {
      bVar1 = TestCase(this,0x11c1fc0,0);
      bVar2 = TestCase(this,0x11c2040,0);
      bVar3 = TestCase(this,0x11c2100,0);
      local_2e = (bVar2 & bVar1 & local_2e & bVar3) != 0;
    }
    for (local_74 = 0; local_74 < 5; local_74 = local_74 + 1) {
      bVar1 = TestCase(this,0x11c2320,0);
      local_2e = (local_2e & bVar1) != 0;
    }
    do {
      iVar4 = (**(code **)(lVar6 + 0x800))();
    } while (iVar4 != 0);
    if (local_2e == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DataTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	m_pNamedBufferData		  = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pNamedBufferSubData	 = (PFNGLNAMEDBUFFERSUBDATA)gl.namedBufferSubData;
	m_pNamedBufferStorage	 = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pCopyNamedBufferSubData = (PFNGLCOPYNAMEDBUFFERSUBDATA)gl.copyNamedBufferSubData;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pNamedBufferSubData) ||
			(DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pCopyNamedBufferSubData))
		{
			throw 0;
		}

		/* BufferData tests */
		static const glw::GLenum hints[] = { GL_STREAM_DRAW,  GL_STREAM_READ,  GL_STREAM_COPY,
											 GL_STATIC_DRAW,  GL_STATIC_READ,  GL_STATIC_COPY,
											 GL_DYNAMIC_DRAW, GL_DYNAMIC_READ, GL_DYNAMIC_COPY };
		static const glw::GLuint hints_count = sizeof(hints) / sizeof(hints[0]);

		for (glw::GLuint i = 0; i < hints_count; ++i)
		{
			is_ok &= TestCase(&DataTest::UploadUsingNamedBufferData, hints[i]);
			is_ok &= TestCase(&DataTest::UploadUsingNamedBufferSubData, hints[i]);
			is_ok &= TestCase(&DataTest::UploadUsingCopyNamedBufferSubData, hints[i]);
		}

		/* BufferStorage Tests */
		static const glw::GLenum bits[] = { GL_MAP_READ_BIT | GL_DYNAMIC_STORAGE_BIT,
											GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT,
											GL_MAP_READ_BIT | GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT,
											GL_MAP_READ_BIT | GL_CLIENT_STORAGE_BIT };
		static const glw::GLuint bits_count = sizeof(bits) / sizeof(bits[0]);

		for (glw::GLuint i = 0; i < bits_count; ++i)
		{
			is_ok &= TestCase(&DataTest::UploadUsingNamedBufferStorage, bits[i]);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}